

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateCharacterState.cpp
# Opt level: O3

void __thiscall
CreateCharacterState::processSelectCharacter
          (CreateCharacterState *this,string *input,shared_ptr<Connection> *connection)

{
  GameData *this_00;
  pointer pcVar1;
  element_type *name;
  Connection *pCVar2;
  Player *this_01;
  CreateCharacterState *pCVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  mapped_type *pmVar10;
  string *psVar11;
  undefined8 uVar12;
  _Rb_tree_header *p_Var13;
  shared_ptr<GameData> *game_data;
  _Alloc_hider _Var14;
  uint uVar15;
  shared_ptr<Player> player;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  characters;
  string character;
  GameStates local_2d2;
  CreateCharacterState *local_2d0;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  shared_ptr<Connection> local_2a8;
  shared_ptr<Connection> local_298;
  shared_ptr<Connection> local_288;
  _Base_ptr local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  undefined1 local_258 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_228 [16];
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188 [3];
  ios_base local_138 [264];
  
  iVar5 = std::__cxx11::string::compare((char *)input);
  if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)input), iVar5 == 0)) {
    local_278 = (_Base_ptr)connection;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    p_Var9 = (this->m_race_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var13 = &(this->m_race_map)._M_t._M_impl.super__Rb_tree_header;
    local_2d0 = this;
    if ((_Rb_tree_header *)p_Var9 != p_Var13) {
      do {
        poVar8 = (ostream *)
                 std::ostream::operator<<((ostream *)(local_1b8 + 0x10),p_Var9[1]._M_color);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)(p_Var9[1]._M_parent)->_M_right,
                            *(long *)(p_Var9[1]._M_parent + 1));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\r\n",2);
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var13);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Choose a race\r\n",0xf);
    std::__cxx11::stringbuf::str();
    p_Var9 = local_278;
    pCVar3 = local_2d0;
    local_288.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)local_278;
    local_288.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278->_M_parent)->_M_pi;
    if (local_288.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_288.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_288.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_288.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_288.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Sender::Send(&local_1d8,&local_288);
    if (local_288.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_288.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    local_2c8._0_4_ = Connection::GetID(*(Connection **)p_Var9);
    pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[](&pCVar3->m_state_map,(key_type *)local_2c8);
    *pmVar10 = 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    return;
  }
  this_00 = (this->super_GameState).game_data.
            super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Connection::GetUsername_abi_cxx11_
            ((string *)local_2c8,
             (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  GameData::GetAccount((Account *)local_1b8,this_00,(string *)local_2c8);
  Account::GetCharacters_abi_cxx11_(&local_270,(Account *)local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_188);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_) != local_2b8) {
    operator_delete((undefined1 *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_));
  }
  pcVar1 = (input->_M_dataplus)._M_p;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar1,pcVar1 + input->_M_string_length);
  bVar4 = Utils::IsNumber(&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (bVar4) {
    std::__cxx11::string::string
              ((string *)local_1b8,(input->_M_dataplus)._M_p,(allocator *)&local_2d2);
    uVar12 = local_1b8._0_8_;
    piVar6 = __errno_location();
    local_2d0 = (CreateCharacterState *)CONCAT44(local_2d0._4_4_,*piVar6);
    *piVar6 = 0;
    lVar7 = strtol((char *)uVar12,(char **)local_2c8,10);
    if ((pointer)CONCAT44(local_2c8._4_4_,local_2c8._0_4_) == (pointer)uVar12) {
      std::__throw_invalid_argument("stoi");
LAB_0015a826:
      uVar12 = std::__throw_out_of_range("stoi");
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_);
      }
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_270);
      _Unwind_Resume(uVar12);
    }
    uVar15 = (uint)lVar7;
    if (((int)uVar15 != lVar7) || (*piVar6 == 0x22)) goto LAB_0015a826;
    if (*piVar6 == 0) {
      *piVar6 = (int)local_2d0;
    }
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_);
    }
    if (((int)uVar15 < 1) ||
       ((ulong)((long)local_270.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_270.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < (ulong)(uVar15 & 0x7fffffff)
       )) goto LAB_0015a43b;
    local_1b8._0_8_ = local_1b8 + 0x10;
    pcVar1 = local_270.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar15 - 1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b8,pcVar1,
               pcVar1 + local_270.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar15 - 1]._M_string_length);
    game_data = &(this->super_GameState).game_data;
    name = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_238._M_allocated_capacity = (size_type)local_228;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,local_1b8._0_8_,
               (char *)(local_1b8._0_8_ + (long)(_Rb_tree_color *)local_1b8._8_8_));
    GameData::GetPlayer((GameData *)local_2c8,(string *)name);
    if ((undefined1 *)local_238._M_allocated_capacity != local_228) {
      operator_delete((void *)local_238._M_allocated_capacity);
    }
    this_01 = (Player *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_);
    iVar5 = Connection::GetID((connection->
                              super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    Player::SetID(this_01,iVar5);
    Connection::SetPlayer
              ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               (shared_ptr<Player> *)local_2c8);
    pCVar2 = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar11 = Player::GetPlayerName_abi_cxx11_((Player *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_));
    Connection::SetCharacterName(pCVar2,psVar11);
    pCVar2 = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar11 = Player::GetPlayerClass_abi_cxx11_((Player *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_))
    ;
    Connection::SetCharacterClass(pCVar2,psVar11);
    pCVar2 = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar11 = Player::GetPlayerRaceStr_abi_cxx11_
                        ((Player *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_));
    Connection::SetCharacterRace(pCVar2,psVar11);
    local_258._0_8_ = (pointer)(local_258 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"Character Selected\r\n","")
    ;
    local_2a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_2a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_2a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_2a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_2a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_2a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_2a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Sender::Send((string *)local_258,&local_2a8);
    if (local_2a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2a8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
      operator_delete((void *)local_258._0_8_);
    }
    local_2d2 = PLAYING;
    Connection::SetState
              ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               &local_2d2,game_data);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_);
    }
    _Var14._M_p = (pointer)local_1b8._0_8_;
    if ((undefined1 *)local_1b8._0_8_ == local_1b8 + 0x10) goto LAB_0015a63d;
  }
  else {
LAB_0015a43b:
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Invalid Selection\n","");
    local_298.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_298.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_298.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_298.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_298.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_298.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_298.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Sender::Send(&local_218,&local_298);
    if (local_298.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_298.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    _Var14._M_p = local_218._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p == &local_218.field_2) goto LAB_0015a63d;
  }
  operator_delete(_Var14._M_p);
LAB_0015a63d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_270);
  return;
}

Assistant:

void CreateCharacterState::processSelectCharacter(const std::string &input, std::shared_ptr<Connection> connection) {
    if(input == "N" or input == "n") {
        std::stringstream ss;
        for(const auto& race : m_race_map)
        {
            ss << race.first << " " << race.second->getRace_name() << "\r\n";
        }
        ss << "Choose a race\r\n";
        Sender::Send(ss.str(), connection);
        m_state_map[connection->GetID()] = CHOOSE_RACE;
    }
    else {
        // validate entry
        auto characters = game_data->GetAccount(connection->GetUsername()).GetCharacters();
        int selection = 0;
        if(Utils::IsNumber(input))
            selection = std::stoi(input.c_str());
        if(selection < 1 or selection > characters.size())
        {
            Sender::Send("Invalid Selection\n", connection);
        }
        else {
            std::string character = characters[selection - 1];
            std::shared_ptr<Player> player = game_data->GetPlayer(character);
            player->SetID(connection->GetID());
            connection->SetPlayer(player);
            connection->SetCharacterName(player->GetPlayerName());
            connection->SetCharacterClass(player->GetPlayerClass());
            connection->SetCharacterRace(player->GetPlayerRaceStr());
            Sender::Send("Character Selected\r\n", connection);
            connection->SetState(GameStates::PLAYING, game_data);
        }
    }
}